

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cc
# Opt level: O1

void __thiscall DisplayNCurses::render(DisplayNCurses *this,SatLookAngles *sats)

{
  pointer ppVar1;
  pointer pcVar2;
  char *__s;
  long *plVar3;
  bool bVar4;
  bool bVar5;
  ostream *poVar6;
  char cVar7;
  char cVar8;
  int iVar9;
  ITEM **items;
  ulong *puVar10;
  ulong *puVar11;
  WINDOW *pWVar12;
  size_t sVar13;
  uint uVar14;
  undefined8 uVar15;
  long lVar16;
  ulong uVar17;
  pointer ppVar18;
  SatLookAngles *sats_00;
  DisplayNCurses *pDVar19;
  long lVar20;
  long *plVar21;
  uint uVar22;
  ulong uVar23;
  array<std::pair<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_12UL>
  fields;
  string __str_2;
  string colNames;
  string __str_1;
  stringstream ss;
  undefined1 *local_6f8;
  undefined8 local_6f0;
  undefined1 local_6e8;
  undefined7 uStack_6e7;
  undefined8 uStack_6e0;
  char **local_6d8;
  char **local_6d0;
  char **local_6c8;
  char **local_6c0;
  char **local_6b8;
  char **local_6b0;
  char **local_6a8;
  undefined8 local_6a0;
  string local_698;
  DisplayNCurses *local_678;
  MENU *local_670;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_668;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_648;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_628;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_608;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  SatLookAngles *local_588;
  WINDOW *local_580;
  long *local_578;
  ostream *local_570;
  long local_568;
  undefined8 local_560;
  undefined4 uStack_558;
  undefined4 uStack_554;
  char *local_550;
  undefined1 *local_548;
  undefined8 local_540;
  undefined8 local_538;
  undefined8 uStack_530;
  char *local_528;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_520;
  size_type local_518;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_510;
  char *local_500;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4f8;
  size_type local_4f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4e8;
  char *local_4d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4d0;
  size_type local_4c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4c0;
  char *local_4b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4a8;
  size_type local_4a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_498;
  char *local_488;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_480;
  size_type local_478;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_470;
  char *local_460;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_458;
  size_type local_450;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_448;
  char *local_438;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_430;
  size_type local_428;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_420;
  char *local_410;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_408;
  size_type local_400;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f8;
  char *local_3e8;
  char *local_3e0;
  char local_3d0 [8];
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined1 *local_3b8;
  undefined8 local_3b0;
  long local_3a8 [2];
  undefined8 local_398;
  string *local_390;
  char *local_388;
  uint local_380;
  char local_378 [8];
  undefined8 uStack_370;
  DateTime local_368;
  long *local_360;
  long local_350 [2];
  ostream *local_340;
  long local_338;
  uint local_330;
  undefined4 uStack_32c;
  undefined4 uStack_328;
  undefined4 uStack_324;
  long alStack_320 [12];
  ios_base local_2c0 [264];
  stringstream local_1b8 [16];
  long local_1a8 [2];
  undefined8 uStack_198;
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  ppVar18 = (sats->_sats).
            super__Vector_base<std::pair<Tle,_CoordTopocentric>,_std::allocator<std::pair<Tle,_CoordTopocentric>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppVar1 = (sats->_sats).
           super__Vector_base<std::pair<Tle,_CoordTopocentric>,_std::allocator<std::pair<Tle,_CoordTopocentric>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar16 = (long)ppVar18 - (long)ppVar1 >> 3;
  uVar17 = lVar16 * -0x1084210842108421;
  uVar23 = -(ulong)(uVar17 + 1 >> 0x3d != 0) | lVar16 * 0x7bdef7bdef7bdef8 + 8U;
  local_678 = this;
  local_588 = sats;
  items = (ITEM **)operator_new__(uVar23);
  memset(items,0,uVar23);
  uVar23 = lVar16 * -0x1084210842108420;
  puVar10 = (ulong *)operator_new__(-(ulong)(uVar17 >> 0x3b != 0) | uVar23 | 8);
  *puVar10 = uVar17;
  if (ppVar18 != ppVar1) {
    puVar11 = puVar10 + 3;
    do {
      puVar11[-2] = (ulong)puVar11;
      puVar11[-1] = 0;
      *(undefined1 *)puVar11 = 0;
      puVar11 = puVar11 + 4;
      uVar23 = uVar23 - 0x20;
    } while (uVar23 != 0);
  }
  items[lVar16 * 0xf7bdef7bdef7bdf] = (ITEM *)0x0;
  std::__cxx11::stringstream::stringstream(local_1b8);
  *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffff4f | 0x20;
  *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ID",2);
  *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 0x19;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"NAME",4);
  *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 0xf;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"AZIMUTH(deg)",0xc);
  *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 0xf;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ELEVATION(deg)",0xe);
  *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 0xc;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"RANGE(KM)",9);
  std::__cxx11::stringbuf::str();
  uVar22 = 0x19;
  if (0x19 < (int)_LINES) {
    uVar22 = _LINES;
  }
  uVar14 = 0x50;
  if (0x50 < (int)_COLS) {
    uVar14 = _COLS;
  }
  pWVar12 = (WINDOW *)newwin(uVar22,uVar14,0,0);
  sats_00 = local_588;
  box(pWVar12,0x7c,0x3d);
  lVar16 = newwin(0x14,0x4f,(uVar22 >> 1) - 0xc,(uVar14 >> 1) - 0x27);
  wattr_on(lVar16,0x40000,0);
  box(lVar16,0x7c,0x2d);
  wattr_off(lVar16,0x40000,0);
  local_6a0 = new_panel(lVar16);
  local_398 = new_panel();
  local_390 = (string *)(puVar10 + 1);
  local_670 = updateMenu((MENU *)0x0,pWVar12,sats_00,items,local_390,false);
  mvwprintw(pWVar12,0,(uVar14 >> 1) - 0xc,"%s","}-- satnow 0.1.0 --{");
  mvwprintw(pWVar12,1,3,"%s",local_360);
  iVar9 = wmove(pWVar12,uVar22 - 3,1);
  if (iVar9 != -1) {
    whline(pWVar12,0x2d,uVar14 - 2);
  }
  mvwprintw(pWVar12,uVar22 - 2,1,"%s",
            "[Quit: (q)] [Update: (space)] [Movement: (pg)up/(pg)down] [Details: (d)]");
  update_panels();
  doupdate();
  iVar9 = -1;
  if (-1 < local_678->_refreshSecs) {
    iVar9 = local_678->_refreshSecs;
  }
  local_580 = pWVar12;
  wtimeout(_stdscr,iVar9);
  local_6a8 = &local_500;
  local_6b0 = &local_4d8;
  local_6b8 = &local_4b0;
  local_6c0 = &local_488;
  local_6c8 = &local_460;
  local_6d0 = &local_438;
  local_6d8 = &local_410;
  bVar5 = false;
  do {
    iVar9 = wgetch(_stdscr);
    pWVar12 = local_580;
    if (iVar9 < 0x102) {
      if (iVar9 < 100) {
        if ((iVar9 == -1) || (iVar9 == 0x20)) {
          updateMenu(local_670,local_580,sats_00,items,local_390,true);
          refresh();
        }
      }
      else if (iVar9 == 100) {
        if (bVar5) {
          hide_panel(local_6a0);
          bVar5 = (bool)(~bVar5 & 1);
        }
        else {
          uVar15 = current_item(local_670);
          iVar9 = item_index(uVar15);
          uVar17 = (ulong)iVar9;
          ppVar18 = (sats_00->_sats).
                    super__Vector_base<std::pair<Tle,_CoordTopocentric>,_std::allocator<std::pair<Tle,_CoordTopocentric>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar23 = ((long)(sats_00->_sats).
                          super__Vector_base<std::pair<Tle,_CoordTopocentric>,_std::allocator<std::pair<Tle,_CoordTopocentric>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar18 >> 3) *
                   -0x1084210842108421;
          if (uVar23 < uVar17 || uVar23 - uVar17 == 0) {
            __assert_fail("index < size() && \"Invalid index.\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/enferex[P]satnow/main.hh"
                          ,0x51,"SatLookAngle &SatLookAngles::operator[](size_t)");
          }
          local_578 = &local_568;
          lVar20 = *(long *)&ppVar18[uVar17].first.name_._M_dataplus;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_578,lVar20,
                     ppVar18[uVar17].first.name_._M_string_length + lVar20);
          poVar6 = local_570;
          if (local_578 != &local_568) {
            operator_delete(local_578,local_568 + 1);
          }
          ppVar18 = ppVar18 + uVar17;
          if (poVar6 == (ostream *)0x0) {
            uVar22 = (ppVar18->first).norad_number_;
            cVar8 = '\x01';
            if (9 < uVar22) {
              uVar14 = uVar22;
              cVar7 = '\x04';
              do {
                cVar8 = cVar7;
                if (uVar14 < 100) {
                  cVar8 = cVar8 + -2;
                  goto LAB_0010d01f;
                }
                if (uVar14 < 1000) {
                  cVar8 = cVar8 + -1;
                  goto LAB_0010d01f;
                }
                if (uVar14 < 10000) goto LAB_0010d01f;
                bVar4 = 99999 < uVar14;
                uVar14 = uVar14 / 10000;
                cVar7 = cVar8 + '\x04';
              } while (bVar4);
              cVar8 = cVar8 + '\x01';
            }
LAB_0010d01f:
            local_578 = &local_568;
            std::__cxx11::string::_M_construct((ulong)&local_578,cVar8);
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)local_578,(uint)local_570,uVar22);
            mvwprintw(lVar16,1,1,"Name : %s (NORAD ID)",local_578);
          }
          else {
            local_578 = &local_568;
            lVar20 = *(long *)&(ppVar18->first).name_._M_dataplus;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_578,lVar20,(ppVar18->first).name_._M_string_length + lVar20)
            ;
            mvwprintw(lVar16,1,1,"Name : %s",local_578);
          }
          if (local_578 != &local_568) {
            operator_delete(local_578,local_568 + 1);
          }
          local_578 = &local_568;
          pcVar2 = (ppVar18->first).line_one_._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_578,pcVar2,
                     pcVar2 + (ppVar18->first).line_one_._M_string_length);
          mvwprintw(lVar16,2,1,"Line1: %s",local_578);
          if (local_578 != &local_568) {
            operator_delete(local_578,local_568 + 1);
          }
          local_578 = &local_568;
          pcVar2 = (ppVar18->first).line_two_._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_578,pcVar2,
                     pcVar2 + (ppVar18->first).line_two_._M_string_length);
          mvwprintw(lVar16,3,1,"Line2: %s",local_578);
          if (local_578 != &local_568) {
            operator_delete(local_578,local_568 + 1);
          }
          if (lVar16 == 0) {
            pDVar19 = (DisplayNCurses *)0xffffffff;
          }
          else {
            pDVar19 = (DisplayNCurses *)(ulong)((int)*(short *)(lVar16 + 6) + 1);
          }
          iVar9 = wmove(lVar16,4,1);
          if (iVar9 != -1) {
            whline(lVar16,0x2d,(int)pDVar19 + -2);
          }
          uVar22 = (ppVar18->first).norad_number_;
          cVar8 = '\x01';
          if (9 < uVar22) {
            uVar14 = uVar22;
            cVar7 = '\x04';
            do {
              cVar8 = cVar7;
              if (uVar14 < 100) {
                cVar8 = cVar8 + -2;
                goto LAB_0010d238;
              }
              if (uVar14 < 1000) {
                cVar8 = cVar8 + -1;
                goto LAB_0010d238;
              }
              if (uVar14 < 10000) goto LAB_0010d238;
              bVar4 = 99999 < uVar14;
              uVar14 = uVar14 / 10000;
              cVar7 = cVar8 + '\x04';
            } while (bVar4);
            cVar8 = cVar8 + '\x01';
          }
LAB_0010d238:
          local_678 = pDVar19;
          local_340 = (ostream *)&local_330;
          std::__cxx11::string::_M_construct((ulong)&local_340,cVar8);
          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_340,(uint)local_338,uVar22);
          local_578 = (long *)0x115c55;
          if (local_340 == (ostream *)&local_330) {
            uStack_558 = uStack_328;
            uStack_554 = uStack_324;
            local_570 = (ostream *)&local_560;
          }
          else {
            local_570 = local_340;
          }
          local_560 = CONCAT44(uStack_32c,local_330);
          local_568 = local_338;
          local_338 = 0;
          local_330 = local_330 & 0xffffff00;
          pcVar2 = (ppVar18->first).int_designator_._M_dataplus._M_p;
          local_6f8 = &local_6e8;
          local_340 = (ostream *)&local_330;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_6f8,pcVar2,
                     pcVar2 + (ppVar18->first).int_designator_._M_string_length);
          local_550 = "Designator";
          if (local_6f8 == &local_6e8) {
            uStack_530 = uStack_6e0;
            local_548 = (undefined1 *)&local_538;
          }
          else {
            local_548 = local_6f8;
          }
          local_538 = CONCAT71(uStack_6e7,local_6e8);
          local_540 = local_6f0;
          local_6f0 = 0;
          local_6e8 = 0;
          local_368.m_encoded = (ppVar18->first).epoch_.m_encoded;
          local_6f8 = &local_6e8;
          DateTime::ToString_abi_cxx11_(&local_698,&local_368);
          local_528 = "Epoch";
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_698._M_dataplus._M_p == &local_698.field_2) {
            local_510._8_8_ = local_698.field_2._8_8_;
            local_520 = &local_510;
          }
          else {
            local_520 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_698._M_dataplus._M_p;
          }
          local_510._M_allocated_capacity._1_7_ = local_698.field_2._M_allocated_capacity._1_7_;
          local_510._M_local_buf[0] = local_698.field_2._M_local_buf[0];
          local_518 = local_698._M_string_length;
          local_698._M_string_length = 0;
          local_698.field_2._M_local_buf[0] = '\0';
          local_698._M_dataplus._M_p = (pointer)&local_698.field_2;
          __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                    (&local_628,vsnprintf,0x148,"%f",SUB84((ppVar18->first).bstar_,0));
          local_500 = "BSTAR(drag term)";
          local_4f8 = &local_4e8;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_628._M_dataplus._M_p == &local_628.field_2) {
            local_4e8._8_8_ = local_628.field_2._8_8_;
          }
          else {
            local_4f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_628._M_dataplus._M_p;
          }
          local_4e8._M_allocated_capacity._1_7_ = local_628.field_2._M_allocated_capacity._1_7_;
          local_4e8._M_local_buf[0] = local_628.field_2._M_local_buf[0];
          local_4f0 = local_628._M_string_length;
          local_628._M_string_length = 0;
          local_628.field_2._M_local_buf[0] = '\0';
          local_628._M_dataplus._M_p = (pointer)&local_628.field_2;
          __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                    (&local_648,vsnprintf,0x148,"%f",SUB84((ppVar18->first).inclination_,0));
          local_4d8 = "Inclination(deg)";
          local_4d0 = &local_4c0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_648._M_dataplus._M_p == &local_648.field_2) {
            local_4c0._8_8_ = local_648.field_2._8_8_;
          }
          else {
            local_4d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_648._M_dataplus._M_p;
          }
          local_4c0._M_allocated_capacity._1_7_ = local_648.field_2._M_allocated_capacity._1_7_;
          local_4c0._M_local_buf[0] = local_648.field_2._M_local_buf[0];
          local_4c8 = local_648._M_string_length;
          local_648._M_string_length = 0;
          local_648.field_2._M_local_buf[0] = '\0';
          local_648._M_dataplus._M_p = (pointer)&local_648.field_2;
          __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                    (&local_668,vsnprintf,0x148,"%f",SUB84((ppVar18->first).right_ascending_node_,0)
                    );
          local_4b0 = "RightAscention(deg)";
          local_4a8 = &local_498;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_668._M_dataplus._M_p == &local_668.field_2) {
            local_498._8_8_ = local_668.field_2._8_8_;
          }
          else {
            local_4a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_668._M_dataplus._M_p;
          }
          local_498._M_allocated_capacity._1_7_ = local_668.field_2._M_allocated_capacity._1_7_;
          local_498._M_local_buf[0] = local_668.field_2._M_local_buf[0];
          local_4a0 = local_668._M_string_length;
          local_668._M_string_length = 0;
          local_668.field_2._M_local_buf[0] = '\0';
          local_668._M_dataplus._M_p = (pointer)&local_668.field_2;
          __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                    (&local_5a8,vsnprintf,0x148,"%f",SUB84((ppVar18->first).eccentricity_,0));
          local_488 = "Eccentricity";
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5a8._M_dataplus._M_p == &local_5a8.field_2) {
            local_470._8_8_ = local_5a8.field_2._8_8_;
            local_480 = &local_470;
          }
          else {
            local_480 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_5a8._M_dataplus._M_p;
          }
          local_470._M_allocated_capacity._1_7_ = local_5a8.field_2._M_allocated_capacity._1_7_;
          local_470._M_local_buf[0] = local_5a8.field_2._M_local_buf[0];
          local_478 = local_5a8._M_string_length;
          local_5a8._M_string_length = 0;
          local_5a8.field_2._M_local_buf[0] = '\0';
          local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
          __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                    (&local_5c8,vsnprintf,0x148,"%f",SUB84((ppVar18->first).argument_perigee_,0));
          local_460 = "ArgOfPerigee(deg)";
          local_458 = &local_448;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5c8._M_dataplus._M_p == &local_5c8.field_2) {
            local_448._8_8_ = local_5c8.field_2._8_8_;
          }
          else {
            local_458 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_5c8._M_dataplus._M_p;
          }
          local_448._M_allocated_capacity._1_7_ = local_5c8.field_2._M_allocated_capacity._1_7_;
          local_448._M_local_buf[0] = local_5c8.field_2._M_local_buf[0];
          local_450 = local_5c8._M_string_length;
          local_5c8._M_string_length = 0;
          local_5c8.field_2._M_local_buf[0] = '\0';
          local_5c8._M_dataplus._M_p = (pointer)&local_5c8.field_2;
          __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                    (&local_5e8,vsnprintf,0x148,"%f",SUB84((ppVar18->first).mean_anomaly_,0));
          local_438 = "MeanAnomaly(deg)";
          local_430 = &local_420;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5e8._M_dataplus._M_p == &local_5e8.field_2) {
            local_420._8_8_ = local_5e8.field_2._8_8_;
          }
          else {
            local_430 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_5e8._M_dataplus._M_p;
          }
          local_420._M_allocated_capacity._1_7_ = local_5e8.field_2._M_allocated_capacity._1_7_;
          local_420._M_local_buf[0] = local_5e8.field_2._M_local_buf[0];
          local_428 = local_5e8._M_string_length;
          local_5e8._M_string_length = 0;
          local_5e8.field_2._M_local_buf[0] = '\0';
          local_5e8._M_dataplus._M_p = (pointer)&local_5e8.field_2;
          __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                    (&local_608,vsnprintf,0x148,"%f",SUB84((ppVar18->first).mean_motion_,0));
          local_410 = "MeanMotion(revs per day)";
          local_408 = &local_3f8;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_608._M_dataplus._M_p == &local_608.field_2) {
            local_3f8._8_8_ = local_608.field_2._8_8_;
          }
          else {
            local_408 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_608._M_dataplus._M_p;
          }
          local_3f8._M_allocated_capacity._1_7_ = local_608.field_2._M_allocated_capacity._1_7_;
          local_3f8._M_local_buf[0] = local_608.field_2._M_local_buf[0];
          local_400 = local_608._M_string_length;
          local_608._M_string_length = 0;
          local_608.field_2._M_local_buf[0] = '\0';
          uVar22 = (ppVar18->first).orbit_number_;
          cVar8 = '\x01';
          if (9 < uVar22) {
            uVar14 = uVar22;
            cVar7 = '\x04';
            do {
              cVar8 = cVar7;
              if (uVar14 < 100) {
                cVar8 = cVar8 + -2;
                goto LAB_0010d91c;
              }
              if (uVar14 < 1000) {
                cVar8 = cVar8 + -1;
                goto LAB_0010d91c;
              }
              if (uVar14 < 10000) goto LAB_0010d91c;
              bVar4 = 99999 < uVar14;
              uVar14 = uVar14 / 10000;
              cVar7 = cVar8 + '\x04';
            } while (bVar4);
            cVar8 = cVar8 + '\x01';
          }
LAB_0010d91c:
          local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
          local_388 = local_378;
          std::__cxx11::string::_M_construct((ulong)&local_388,cVar8);
          std::__detail::__to_chars_10_impl<unsigned_int>(local_388,local_380,uVar22);
          local_3e8 = "RevolutionNumber";
          local_3e0 = local_3d0;
          if (local_388 == local_378) {
            uStack_3c8 = uStack_370;
          }
          else {
            local_3e0 = local_388;
          }
          local_3c0 = 0;
          local_3b8 = (undefined1 *)local_3a8;
          local_3b0 = 0;
          local_3a8[0]._0_1_ = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_608._M_dataplus._M_p != &local_608.field_2) {
            operator_delete(local_608._M_dataplus._M_p,
                            CONCAT71(local_608.field_2._M_allocated_capacity._1_7_,
                                     local_608.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
            operator_delete(local_5e8._M_dataplus._M_p,
                            CONCAT71(local_5e8.field_2._M_allocated_capacity._1_7_,
                                     local_5e8.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
            operator_delete(local_5c8._M_dataplus._M_p,
                            CONCAT71(local_5c8.field_2._M_allocated_capacity._1_7_,
                                     local_5c8.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
            operator_delete(local_5a8._M_dataplus._M_p,
                            CONCAT71(local_5a8.field_2._M_allocated_capacity._1_7_,
                                     local_5a8.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_668._M_dataplus._M_p != &local_668.field_2) {
            operator_delete(local_668._M_dataplus._M_p,
                            CONCAT71(local_668.field_2._M_allocated_capacity._1_7_,
                                     local_668.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_648._M_dataplus._M_p != &local_648.field_2) {
            operator_delete(local_648._M_dataplus._M_p,
                            CONCAT71(local_648.field_2._M_allocated_capacity._1_7_,
                                     local_648.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_628._M_dataplus._M_p != &local_628.field_2) {
            operator_delete(local_628._M_dataplus._M_p,
                            CONCAT71(local_628.field_2._M_allocated_capacity._1_7_,
                                     local_628.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_698._M_dataplus._M_p != &local_698.field_2) {
            operator_delete(local_698._M_dataplus._M_p,
                            CONCAT71(local_698.field_2._M_allocated_capacity._1_7_,
                                     local_698.field_2._M_local_buf[0]) + 1);
          }
          if (local_6f8 != &local_6e8) {
            operator_delete(local_6f8,CONCAT71(uStack_6e7,local_6e8) + 1);
          }
          pDVar19 = local_678;
          if (local_340 != (ostream *)&local_330) {
            operator_delete(local_340,CONCAT44(uStack_32c,local_330) + 1);
          }
          iVar9 = 6;
          lVar20 = 0x10;
          do {
            std::__cxx11::stringstream::stringstream((stringstream *)&local_340);
            *(long *)((long)alStack_320 + *(long *)(CONCAT44(uStack_32c,local_330) + -0x18)) =
                 (long)(((int)(((uint)((ulong)pDVar19 >> 0x1f) & 1) + (int)pDVar19) >> 1) + -8);
            __s = *(char **)((long)&local_588 + lVar20);
            if (__s == (char *)0x0) {
              std::ios::clear((int)*(undefined8 *)(CONCAT44(uStack_32c,local_330) + -0x18) +
                              (int)(ostream *)&local_330);
            }
            else {
              sVar13 = strlen(__s);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_330,__s,sVar13);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_330,": ",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_330,*(char **)((long)&local_580 + lVar20),
                       *(long *)((long)&local_578 + lVar20));
            std::__cxx11::stringbuf::str();
            mvwprintw(lVar16,iVar9,1,"%s",local_6f8);
            if (local_6f8 != &local_6e8) {
              operator_delete(local_6f8,CONCAT71(uStack_6e7,local_6e8) + 1);
            }
            std::__cxx11::stringstream::~stringstream((stringstream *)&local_340);
            std::ios_base::~ios_base(local_2c0);
            iVar9 = iVar9 + 1;
            lVar20 = lVar20 + 0x28;
          } while (lVar20 != 0x1f0);
          lVar20 = -0x1e0;
          plVar21 = local_3a8;
          do {
            if (plVar21 != (long *)plVar21[-2]) {
              operator_delete((long *)plVar21[-2],*plVar21 + 1);
            }
            plVar21 = plVar21 + -5;
            lVar20 = lVar20 + 0x28;
          } while (lVar20 != 0);
          show_panel(local_6a0);
          sats_00 = local_588;
          top_panel(local_6a0);
          bVar5 = (bool)(~bVar5 & 1);
        }
      }
      else if (iVar9 == 0x71) {
        if ((long)(sats_00->_sats).
                  super__Vector_base<std::pair<Tle,_CoordTopocentric>,_std::allocator<std::pair<Tle,_CoordTopocentric>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(sats_00->_sats).
                  super__Vector_base<std::pair<Tle,_CoordTopocentric>,_std::allocator<std::pair<Tle,_CoordTopocentric>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != -0xf8) {
          uVar17 = 0;
          do {
            free_item(items[uVar17]);
            uVar17 = uVar17 + 1;
          } while (uVar17 < ((long)(sats_00->_sats).
                                   super__Vector_base<std::pair<Tle,_CoordTopocentric>,_std::allocator<std::pair<Tle,_CoordTopocentric>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(sats_00->_sats).
                                   super__Vector_base<std::pair<Tle,_CoordTopocentric>,_std::allocator<std::pair<Tle,_CoordTopocentric>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x1084210842108421 + 1U);
        }
        operator_delete__(items);
        lVar16 = *puVar10 * 0x20;
        uVar17 = lVar16 + 8;
        uVar23 = *puVar10;
        while (uVar23 != 0) {
          plVar21 = (long *)((long)puVar10 + lVar16 + -8);
          plVar3 = *(long **)((long)puVar10 + lVar16 + -0x18);
          if (plVar21 != plVar3) {
            operator_delete(plVar3,*plVar21 + 1);
          }
          lVar16 = lVar16 + -0x20;
          uVar23 = lVar16;
        }
        operator_delete__(puVar10,uVar17);
        delwin(pWVar12);
        del_panel(local_398);
        del_panel(local_6a0);
        if (local_360 != local_350) {
          operator_delete(local_360,local_350[0] + 1);
        }
        std::__cxx11::stringstream::~stringstream(local_1b8);
        std::ios_base::~ios_base(local_138);
        return;
      }
    }
    else {
      if (iVar9 < 0x152) {
        uVar15 = 0x203;
        if (iVar9 != 0x102) {
          if (iVar9 != 0x103) goto LAB_0010cf9f;
          uVar15 = 0x202;
        }
      }
      else if (iVar9 == 0x152) {
        uVar15 = 0x206;
      }
      else {
        if (iVar9 != 0x153) goto LAB_0010cf9f;
        uVar15 = 0x207;
      }
      menu_driver(local_670,uVar15);
    }
LAB_0010cf9f:
    update_panels();
    doupdate();
  } while( true );
}

Assistant:

void DisplayNCurses::render(SatLookAngles &sats) {
#if HAVE_GUI
  // Build the menu and have a place to store the strings.
  auto items = new ITEM *[sats.size() + 1]();
  auto itemStrs = new std::string[sats.size()];
  items[sats.size()] = nullptr;

  // Column names.
  std::stringstream ss;
  ss << std::left << std::setw(10) << "ID" << std::setw(25) << "NAME"
     << std::setw(15) << "AZIMUTH(deg)" << std::setw(15) << "ELEVATION(deg)"
     << std::setw(12) << "RANGE(KM)";
  std::string colNames = ss.str();

  // Create a window to decorate the menu with.
  const int rows = std::max(LINES, 25);
  const int cols = std::max(COLS, 80);
  auto win = newwin(rows, cols, 0, 0);
  box(win, '|', '=');

  // Create another window to hold selected information.
  auto infoWin = newwin(20, 79, (rows / 2) - 12, (cols / 2) - 39);
  wattron(infoWin, A_REVERSE);
  box(infoWin, '|', '-');
  wattroff(infoWin, A_REVERSE);

  // Create panels.
  auto infoPanel = new_panel(infoWin);
  auto mainPanel = new_panel(win);
  bool showInfo = false;

  // Populate menu ('false' avoids calculating new look angles);
  MENU *menu = updateMenu(nullptr, win, sats, items, itemStrs, false);

  // Add title and column names.
  mvwprintw(win, 0, (cols / 2 - 12), "%s", "}-- satnow " VER " --{");
  mvwprintw(win, 1, 3, "%s", colNames.c_str());

  // Print a legend at the bottom.
  mvwhline(win, rows - 3, 1, '-', cols - 2);
  mvwprintw(win, rows - 2, 1, "%s",
            "[Quit: (q)] [Update: (space)] "
            "[Movement: (pg)up/(pg)down] [Details: (d)]");

  // Display.
  update_panels();
  doupdate();
  const int msecs = (_refreshSecs < 0) ? -1 : _refreshSecs;
  timeout(msecs);
  int c;
  while ((c = getch()) != 'q') {
    switch (c) {
    case KEY_DOWN:
      menu_driver(menu, REQ_DOWN_ITEM);
      break;
    case KEY_UP:
      menu_driver(menu, REQ_UP_ITEM);
      break;
    case KEY_NPAGE:
      menu_driver(menu, REQ_SCR_DPAGE);
      break;
    case KEY_PPAGE:
      menu_driver(menu, REQ_SCR_UPAGE);
      break;
    case 'd':
      showInfo = showInfo ^ true;
      // Swap the main and info panel.
      if (showInfo) {
        const ITEM *ci = current_item(menu);
        updateInfoWindow(infoWin, sats[item_index(ci)]);
        show_panel(infoPanel);
        top_panel(infoPanel);
      } else
        hide_panel(infoPanel);
      break;
    case ' ':
    case ERR:
      updateMenu(menu, win, sats, items, itemStrs, true);
      refresh();
      break;
    }
    update_panels();
    doupdate();
  }

  // Cleanup.
  for (size_t i = 0; i < sats.size() + 1; ++i)
    free_item(items[i]);
  delete[] items;
  delete[] itemStrs;
  delwin(win);
  del_panel(mainPanel);
  del_panel(infoPanel);
#endif // HAVE_GUI
}